

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<long>::FastAdder::Add(FastAdder *this,long *val)

{
  int iVar1;
  RepeatedField<long> *this_00;
  long lVar2;
  
  iVar1 = this->index_;
  if (iVar1 == this->capacity_) {
    this_00 = this->repeated_field_;
    this_00->current_size_ = iVar1;
    Reserve(this_00,iVar1 + 1);
    this->capacity_ = this->repeated_field_->total_size_;
    this->buffer_ = (long *)this->repeated_field_->arena_or_elements_;
  }
  lVar2 = *val;
  iVar1 = this->index_;
  this->index_ = iVar1 + 1;
  this->buffer_[iVar1] = lVar2;
  return;
}

Assistant:

void Add(const Element& val) {
      if (kIsPod) {
        if (index_ == capacity_) {
          repeated_field_->current_size_ = index_;
          repeated_field_->Reserve(index_ + 1);
          capacity_ = repeated_field_->total_size_;
          buffer_ = repeated_field_->unsafe_elements();
        }
        buffer_[index_++] = val;
      } else {
        repeated_field_->Add(val);
      }
    }